

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndForEachCommand.cxx
# Opt level: O2

bool __thiscall
cmEndForEachCommand::InvokeInitialPass
          (cmEndForEachCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1,
          cmExecutionStatus *param_2)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             "An ENDFOREACH command was found outside of a proper FOREACH ENDFOREACH structure. Or its arguments did not match the opening FOREACH command."
             ,&local_31);
  cmCommand::SetError(&this->super_cmCommand,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool cmEndForEachCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const&,
                    cmExecutionStatus &)
{
  this->SetError("An ENDFOREACH command was found outside of a proper "
                 "FOREACH ENDFOREACH structure. Or its arguments did "
                 "not match the opening FOREACH command.");
  return false;
}